

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthStateMonitor.cpp
# Opt level: O1

void __thiscall PartVolumeButton::contextMenuEvent(PartVolumeButton *this,QContextMenuEvent *event)

{
  QAction *pQVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QWidgetAction volumeControlAction;
  QSlider volumeControlSlider;
  QMenu menu;
  QArrayData *local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  QArrayData *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  QWidgetAction local_90 [16];
  QObject local_80 [8];
  QArrayData *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  QPoint local_50 [5];
  
  event[0xc] = (QContextMenuEvent)0x1;
  QMenu::QMenu((QMenu *)local_50,(QWidget *)this);
  QVar2.m_data = (storage_type *)0x6;
  QVar2.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar2);
  local_a8 = local_78;
  uStack_a0 = uStack_70;
  local_98 = local_68;
  pQVar1 = (QAction *)QMenu::addMenu((QString *)local_50);
  if (local_a8 != (QArrayData *)0x0) {
    LOCK();
    (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a8,2,8);
    }
  }
  QWidgetAction::QWidgetAction(local_90,(QObject *)pQVar1);
  QSlider::QSlider((QSlider *)&local_78,(QWidget *)pQVar1);
  QAbstractSlider::setRange((int)&local_78,0);
  QAbstractSlider::setValue((int)&local_78);
  QObject::connect(local_80,(char *)&local_78,(QObject *)"2valueChanged(int)",(char *)this,0x1912c5)
  ;
  QMetaObject::Connection::~Connection((Connection *)local_80);
  QWidgetAction::setDefaultWidget((QWidget *)local_90);
  QWidget::addAction(pQVar1);
  QVar3.m_data = (storage_type *)0xc;
  QVar3.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar3);
  local_c8 = local_a8;
  uStack_c0 = uStack_a0;
  local_b8 = local_98;
  QKeySequence::QKeySequence((QKeySequence *)&local_a8);
  QMenu::addAction((QString *)local_50,(QObject *)&local_c8,(char *)this,
                   (QKeySequence *)"1handleResetVolumeTriggered()");
  QKeySequence::~QKeySequence((QKeySequence *)&local_a8);
  if (local_c8 != (QArrayData *)0x0) {
    LOCK();
    (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_c8,2,8);
    }
  }
  QVar4.m_data = (storage_type *)0x4;
  QVar4.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar4);
  local_c8 = local_a8;
  uStack_c0 = uStack_a0;
  local_b8 = local_98;
  QKeySequence::QKeySequence((QKeySequence *)&local_a8);
  QMenu::addAction((QString *)local_50,(QObject *)&local_c8,(char *)this,
                   (QKeySequence *)"1handleSoloTriggered()");
  QKeySequence::~QKeySequence((QKeySequence *)&local_a8);
  if (local_c8 != (QArrayData *)0x0) {
    LOCK();
    (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_c8,2,8);
    }
  }
  QVar5.m_data = (storage_type *)0xa;
  QVar5.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar5);
  local_c8 = local_a8;
  uStack_c0 = uStack_a0;
  local_b8 = local_98;
  QKeySequence::QKeySequence((QKeySequence *)&local_a8);
  QMenu::addAction((QString *)local_50,(QObject *)&local_c8,(char *)this,
                   (QKeySequence *)"1handleUnmuteAllTriggered()");
  QKeySequence::~QKeySequence((QKeySequence *)&local_a8);
  if (local_c8 != (QArrayData *)0x0) {
    LOCK();
    (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_c8,2,8);
    }
  }
  QVar6.m_data = (storage_type *)0x9;
  QVar6.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar6);
  local_c8 = local_a8;
  uStack_c0 = uStack_a0;
  local_b8 = local_98;
  QKeySequence::QKeySequence((QKeySequence *)&local_a8);
  QMenu::addAction((QString *)local_50,(QObject *)&local_c8,(char *)this,
                   (QKeySequence *)"1handleResetAllTriggered()");
  QKeySequence::~QKeySequence((QKeySequence *)&local_a8);
  if (local_c8 != (QArrayData *)0x0) {
    LOCK();
    (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_c8,2,8);
    }
  }
  QMenu::exec(local_50,(QAction *)(event + 0x30));
  QSlider::~QSlider((QSlider *)&local_78);
  QWidgetAction::~QWidgetAction(local_90);
  QMenu::~QMenu((QMenu *)local_50);
  return;
}

Assistant:

void PartVolumeButton::contextMenuEvent(QContextMenuEvent *event) {
	event->accept();
	QMenu menu(this);
	QMenu *volumeMenu = menu.addMenu("Volume");
	QWidgetAction volumeControlAction(volumeMenu);
	QSlider volumeControlSlider(volumeMenu);
	volumeControlSlider.setRange(0, 100);
	volumeControlSlider.setValue(qBound(0, volume, 100));
	connect(&volumeControlSlider, SIGNAL(valueChanged(int)), SLOT(handleVolumeChanged(int)));
	volumeControlAction.setDefaultWidget(&volumeControlSlider);
	volumeMenu->addAction(&volumeControlAction);
	menu.addAction("Reset Volume", this, SLOT(handleResetVolumeTriggered()));
	menu.addAction("Solo", this, SLOT(handleSoloTriggered()));
	menu.addAction("Unmute All", this, SLOT(handleUnmuteAllTriggered()));
	menu.addAction("Reset All", this, SLOT(handleResetAllTriggered()));
	menu.exec(event->globalPos());
}